

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O1

int query_objlist(char *qstr,obj *olist,int qflags,object_pick **pick_list,int how,
                 _func_boolean_obj_ptr *allow)

{
  long lVar1;
  boolean bVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  nh_objresult *pick_list_00;
  object_pick *poVar7;
  int iVar8;
  uint idx;
  code *__compar;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  obj *poVar13;
  obj *poVar14;
  bool bVar15;
  int nr_items;
  undefined8 *local_60;
  nh_objitem *items;
  undefined8 local_50;
  int local_44;
  object_pick **local_40;
  char *local_38;
  
  nr_items = 0;
  poVar14 = (obj *)0x0;
  items = (nh_objitem *)0x0;
  *pick_list = (object_pick *)0x0;
  local_50 = CONCAT44(local_50._4_4_,qflags) & 0xffffffff00000080;
  uVar9 = (qflags & 0x80U) >> 7;
  if (uVar9 != 0) {
    poVar14 = &zeroobj;
  }
  local_44 = how;
  local_40 = pick_list;
  local_38 = qstr;
  if (olist != (obj *)0x0) {
    poVar13 = olist;
    do {
      bVar2 = (*allow)(poVar13);
      if (bVar2 != '\0') {
        poVar14 = poVar13;
      }
      uVar9 = uVar9 + (bVar2 != '\0');
      poVar13 = *(obj **)((long)poVar13->oextra + ((ulong)(qflags * 8 & 8) - 100));
    } while (poVar13 != (obj *)0x0);
  }
  if (uVar9 == 1) {
    if ((qflags & 2U) != 0) {
      poVar7 = (object_pick *)malloc(0x10);
      *local_40 = poVar7;
      poVar7->obj = poVar14;
      iVar8 = 1;
      if (poVar14 != &zeroobj) {
        iVar8 = poVar14->quan;
      }
      poVar7->count = iVar8;
      return 1;
    }
  }
  else if (uVar9 == 0) {
    return (qflags << 0x1b) >> 0x1f;
  }
  local_60 = (undefined8 *)malloc((ulong)uVar9 << 3);
  if ((uint)local_50 != 0) {
    *local_60 = &zeroobj;
  }
  uVar12 = (uint)((uint)local_50 != 0);
  if (olist != (obj *)0x0) {
    do {
      if (((((qflags & 0x40U) != 0) && (olist->otyp == 0x10e)) &&
          (bVar2 = will_feel_cockatrice(olist,'\0'), bVar2 != '\0')) &&
         (u.uprops[0x21].intrinsic == 0)) {
        free(local_60);
        look_here(0,'\0');
        return 0;
      }
      if ((((qflags & 8U) == 0) ||
          (pcVar5 = strchr(flags.inv_order,(int)olist->oclass), pcVar5 != (char *)0x0)) &&
         (bVar2 = (*allow)(olist), bVar2 != '\0')) {
        lVar6 = (long)(int)uVar12;
        uVar12 = uVar12 + 1;
        local_60[lVar6] = olist;
      }
      olist = *(obj **)((long)olist->oextra + ((ulong)(qflags * 8 & 8) - 100));
    } while (olist != (obj *)0x0);
  }
  if ((qflags & 8U) != 0) {
    uVar4 = (uVar12 - 1) + (uint)((uint)local_50 == 0);
    if (0 < (int)uVar4) {
      if ((qflags & 4U) == 0) {
        __compar = obj_compare;
      }
      else {
        __compar = invo_obj_compare;
      }
      qsort((void *)((long)local_60 + (ulong)((uint)local_50 >> 4)),(ulong)uVar4,8,__compar);
    }
  }
  nr_items = uVar12;
  items = (nh_objitem *)malloc((long)(int)uVar12 * 0x124);
  uVar10 = 0;
  uVar4 = 0;
  if ((uint)local_50 != 0) {
    bVar15 = (qflags & 8U) != 0;
    if (bVar15) {
      add_objitem(&items,&nr_items,MI_HEADING,0,0,"Furniture",(obj *)0x0,'\0');
    }
    idx = (uint)bVar15;
    uVar4 = idx + 1;
    uVar10 = 1;
    add_objitem(&items,&nr_items,MI_NORMAL,idx,1,"a magic chest",&zeroobj,'\0');
  }
  if ((int)uVar10 < (int)uVar12) {
    uVar11 = (ulong)uVar10;
    local_50 = (ulong)uVar12;
    cVar3 = -1;
    do {
      poVar14 = (obj *)local_60[uVar11];
      uVar12 = uVar4;
      if (((qflags & 8U) != 0) && (cVar3 != poVar14->oclass)) {
        uVar12 = uVar4 + 1;
        pcVar5 = let_to_name(poVar14->oclass,'\0');
        add_objitem(&items,&nr_items,MI_HEADING,uVar4,0,pcVar5,poVar14,'\0');
      }
      examine_object(poVar14);
      uVar4 = uVar12 + 1;
      uVar11 = uVar11 + 1;
      pcVar5 = doname(poVar14);
      add_objitem(&items,&nr_items,MI_NORMAL,uVar12,(int)uVar11,pcVar5,poVar14,
                  (byte)((uint)qflags >> 2) & 1);
      cVar3 = poVar14->oclass;
    } while (local_50 != uVar11);
  }
  if ((int)uVar4 < 1) {
    pick_list_00 = (nh_objresult *)0x0;
  }
  else {
    pick_list_00 = (nh_objresult *)malloc((ulong)uVar4 << 3);
    uVar9 = display_objects(items,uVar4,local_38,local_44,pick_list_00);
  }
  if ((int)uVar9 < 1) {
    bVar15 = (int)uVar9 < 0;
    uVar9 = 0;
    if (bVar15) {
      uVar9 = (qflags << 0x1a) >> 0x1f & 0xfffffffe;
    }
  }
  else {
    poVar7 = (object_pick *)malloc((ulong)uVar9 << 4);
    *local_40 = poVar7;
    lVar6 = 0;
    do {
      lVar1 = local_60[(long)*(int *)((long)&pick_list_00->id + lVar6) + -1];
      *(long *)((long)&(*local_40)->obj + lVar6 * 2) = lVar1;
      iVar8 = *(int *)((long)&pick_list_00->count + lVar6);
      if ((iVar8 == -1) || (*(int *)(lVar1 + 0x30) < iVar8)) {
        iVar8 = *(int *)(lVar1 + 0x30);
      }
      *(int *)((long)&(*local_40)->count + lVar6 * 2) = iVar8;
      lVar6 = lVar6 + 8;
    } while ((ulong)uVar9 << 3 != lVar6);
  }
  free(pick_list_00);
  free(local_60);
  free(items);
  return uVar9;
}

Assistant:

int query_objlist(const char *qstr,	/* query string */
		  struct obj *olist,	/* the list to pick from */
		  int qflags,		/* options to control the query */
		  struct object_pick **pick_list,/* return list of items picked */
		  int how,		/* type of query */
		  boolean (*allow)(const struct obj*)) /* allow function */
{
	int n = 0, i, prev_oclass, nr_objects;
	struct obj *curr, *last;
	int nr_items = 0, cur_entry = 0;
	struct nh_objitem *items = NULL;
	struct obj **objlist = NULL;
	struct nh_objresult *selection = NULL;

	*pick_list = NULL;

	/* count the number of items allowed */
	n = 0;
	last = 0;
	if (qflags & SHOW_MAGIC_CHEST) {
	    /* &zeroobj indicates the selection of the 'magic chest' entry */
	    last = &zeroobj;
	    n++;
	}
	for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
	    if ((*allow)(curr)) {
		last = curr;
		n++;
	    }
	}

	if (n == 0)	/* nothing to pick here */
	    return (qflags & SIGNAL_NOMENU) ? -1 : 0;

	if (n == 1 && (qflags & AUTOSELECT_SINGLE)) {
	    *pick_list = malloc(sizeof(struct object_pick));
	    (*pick_list)->obj = last;
	    /* For a magic chest, use a valid but arbitrary count. */
	    (*pick_list)->count = cobj_is_magic_chest(last) ? 1 : last->quan;
	    return 1;
	}

	/* add all allowed objects to the list */
	nr_objects = 0;
	objlist = malloc(n * sizeof(struct obj*));
	if (qflags & SHOW_MAGIC_CHEST)
	    objlist[nr_objects++] = &zeroobj;
	for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
	    if ((qflags & FEEL_COCKATRICE) && curr->otyp == CORPSE &&
		    will_feel_cockatrice(curr, FALSE) && !Stoned) {
		    free(objlist);
		    look_here(0, FALSE);
		    return 0;
	    }
	    if ((!(qflags & INVORDER_SORT) || strchr(flags.inv_order, curr->oclass))
		&& (*allow)(curr))
		objlist[nr_objects++] = curr;
	}

	/* sort the list in place according to (1) inv_order and... */
	if (qflags & INVORDER_SORT) {
	    struct obj **tmp_objlist = objlist;
	    int tmp_nr_objects = nr_objects;
	    int (*objcmp_func)(const void *, const void *) =
		(qflags & USE_INVLET) ?
		    invo_obj_compare :	/* ... (2) only inv_order. */
		    obj_compare;	/* ... (2) object name. */
	    if (qflags & SHOW_MAGIC_CHEST) {
		/* Don't move 'magic chest' entry away from the top. */
		tmp_objlist++;
		tmp_nr_objects--;
	    }
	    if (tmp_nr_objects > 0)
		qsort(tmp_objlist, tmp_nr_objects, sizeof(struct obj *), objcmp_func);
	}

	/* nr_items will be greater than nr_objects, because it counts headers, too */
	nr_items = nr_objects;
	items = malloc(nr_items * sizeof(struct nh_objitem));
	prev_oclass = -1;
	cur_entry = 0;
	i = 0;
	/* magic chest comes first if it was requested */
	if (qflags & SHOW_MAGIC_CHEST) {
	    /* fudge the entries for 'magic chest' */
	    if (qflags & INVORDER_SORT) {
		add_objitem(&items, &nr_items, MI_HEADING, cur_entry++, 0,
			    "Furniture", NULL, FALSE);
	    }
	    /* &zeroobj is handled specially by add_objitem */
	    add_objitem(&items, &nr_items, MI_NORMAL, cur_entry++, i+1,
			"a magic chest", &zeroobj, FALSE);
	    i++;
	}
	/* now go through the objects proper */
	for (; i < nr_objects; i++) {
	    curr = objlist[i];
	    /* if sorting, print type name */
	    if ((qflags & INVORDER_SORT) && prev_oclass != curr->oclass)
		add_objitem(&items, &nr_items, MI_HEADING, cur_entry++, 0,
		            let_to_name(curr->oclass, FALSE), curr, FALSE);
	    /* add the object to the list */
	    examine_object(curr);
	    add_objitem(&items, &nr_items, MI_NORMAL, cur_entry++, i+1,
	                doname(curr), curr, (qflags & USE_INVLET) != 0);
	    prev_oclass = curr->oclass;
	}

	if (cur_entry > 0) {
	    selection = malloc(cur_entry * sizeof(struct nh_objresult));
	    n = display_objects(items, cur_entry, qstr, how, selection);
	}

	if (n > 0) {
	    *pick_list = malloc(n * sizeof(struct object_pick));

	    for (i = 0; i < n; i++) {
		curr = objlist[selection[i].id - 1];
		(*pick_list)[i].obj = curr;
		if (selection[i].count == -1 || selection[i].count > curr->quan)
		    (*pick_list)[i].count = curr->quan;
		else
		    (*pick_list)[i].count = selection[i].count;
	    }
	} else if (n < 0) {
	    /* callers don't expect -1 by this point */
	    n = (qflags & SIGNAL_ESCAPE) ? -2 : 0;
	}
	free(selection);
	free(objlist);
	free(items);

	return n;
}